

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_cache_lcp_2way_parallel<true,unsigned_int>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          uint *cache_input,uint *cache_output,size_t n)

{
  lcp_t *lcp_output_00;
  uint *cache_output_00;
  size_t __n;
  byte *pbVar1;
  byte *pbVar2;
  uchar *puVar3;
  int iVar4;
  bool bVar5;
  MergeResult MVar6;
  MergeResult MVar7;
  uint *puVar8;
  size_t n_00;
  uint uVar9;
  uchar **ppuVar10;
  lcp_t *plVar11;
  uchar **ppuVar12;
  byte bVar13;
  byte bVar14;
  size_t i_1;
  long lVar15;
  lcp_t lVar16;
  lcp_t in_R11;
  ulong uVar17;
  ulong uVar18;
  
  if (0x1f < n) {
    uVar17 = n >> 1;
    MVar6 = mergesort_cache_lcp_2way_parallel<true,unsigned_int>
                      (strings_input,strings_output,lcp_input,lcp_output,cache_input,cache_output,
                       uVar17);
    puVar8 = cache_input;
    plVar11 = lcp_input;
    ppuVar12 = strings_input;
    if (MVar6 != SortedInPlace) {
      puVar8 = cache_output;
      plVar11 = lcp_output;
      ppuVar12 = strings_output;
    }
    check_input<unsigned_int>(ppuVar12,plVar11,puVar8,uVar17);
    ppuVar12 = strings_input + uVar17;
    ppuVar10 = strings_output + uVar17;
    plVar11 = lcp_input + uVar17;
    lcp_output_00 = lcp_output + uVar17;
    puVar8 = cache_input + uVar17;
    cache_output_00 = cache_output + uVar17;
    n_00 = n - uVar17;
    MVar7 = mergesort_cache_lcp_2way_parallel<true,unsigned_int>
                      (ppuVar12,ppuVar10,plVar11,lcp_output_00,puVar8,cache_output_00,n_00);
    if (MVar6 == SortedInPlace) {
      check_input<unsigned_int>(ppuVar12,plVar11,puVar8,n_00);
    }
    else {
      check_input<unsigned_int>(ppuVar10,lcp_output_00,cache_output_00,n_00);
    }
    if (MVar6 != MVar7) {
      __n = uVar17 * 8;
      if (MVar6 == SortedInPlace) {
        memmove(strings_output,strings_input,__n);
        memcpy(cache_output,cache_input,uVar17 * 4);
        memcpy(lcp_output,lcp_input,__n);
        MVar6 = SortedInTemp;
      }
      else {
        memmove(strings_input,strings_output,__n);
        memcpy(cache_input,cache_output,uVar17 * 4);
        memcpy(lcp_input,lcp_output,__n);
        MVar7 = SortedInTemp;
      }
    }
    if (MVar6 == MVar7) {
      if (MVar6 == SortedInPlace) {
        merge_cache_lcp_2way<true,unsigned_int>
                  (strings_input,lcp_input,cache_input,uVar17,ppuVar12,plVar11,puVar8,n_00,
                   strings_output,lcp_output,cache_output);
      }
      else {
        merge_cache_lcp_2way<true,unsigned_int>
                  (strings_output,lcp_output,cache_output,uVar17,ppuVar10,lcp_output_00,
                   cache_output_00,n_00,strings_input,lcp_input,cache_input);
      }
      return (uint)(MVar6 == SortedInPlace);
    }
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x5e2,
                  "MergeResult mergesort_cache_lcp_2way_parallel(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = true, CharT = unsigned int]"
                 );
  }
  ppuVar12 = strings_input;
  if (1 < (long)n) {
    uVar17 = n & 0xffffffff;
    ppuVar10 = strings_input;
    do {
      iVar4 = (int)uVar17;
      uVar17 = (ulong)(iVar4 - 1);
      pbVar1 = ppuVar10[1];
      ppuVar10 = ppuVar10 + 1;
      for (ppuVar12 = ppuVar10; strings_input < ppuVar12; ppuVar12 = ppuVar12 + -1) {
        pbVar2 = ppuVar12[-1];
        bVar13 = *pbVar2;
        bVar14 = *pbVar1;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar13 != bVar14);
        if (bVar13 != 0 && bVar13 == bVar14) {
          in_R11 = 1;
          do {
            bVar13 = pbVar2[in_R11];
            bVar14 = pbVar1[in_R11];
            if (bVar13 == 0) break;
            in_R11 = in_R11 + 1;
          } while (bVar13 == bVar14);
        }
        if (bVar13 <= bVar14) break;
        *ppuVar12 = pbVar2;
      }
      *ppuVar12 = pbVar1;
    } while (2 < iVar4);
  }
  pbVar1 = *strings_input;
  lVar15 = 0;
  ppuVar10 = (uchar **)0x0;
  do {
    if ((pbVar1[lVar15] == 0) || (pbVar1[lVar15] != strings_input[1][lVar15])) {
      bVar5 = false;
      ppuVar12 = ppuVar10;
    }
    else {
      ppuVar10 = (uchar **)((long)ppuVar10 + 1);
      bVar5 = true;
    }
    lVar15 = lVar15 + 1;
  } while (bVar5);
  *lcp_input = (lcp_t)ppuVar12;
  if (pbVar1 != (byte *)0x0) {
    if (*pbVar1 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (uint)*pbVar1 << 0x18;
      if (pbVar1[1] != 0) {
        uVar9 = uVar9 | (uint)pbVar1[1] << 0x10;
        if (pbVar1[2] != 0) {
          uVar9 = uVar9 | CONCAT11(pbVar1[2],pbVar1[3]);
        }
      }
    }
    *cache_input = uVar9;
    if (1 < n - 1) {
      uVar17 = 1;
      do {
        puVar3 = strings_input[uVar17];
        uVar18 = (ulong)((int)uVar17 + 1);
        lVar15 = 0;
        lVar16 = 0;
        do {
          if ((puVar3[lVar15] == '\0') || (puVar3[lVar15] != strings_input[uVar18][lVar15])) {
            bVar5 = false;
            in_R11 = lVar16;
          }
          else {
            lVar16 = lVar16 + 1;
            bVar5 = true;
          }
          lVar15 = lVar15 + 1;
        } while (bVar5);
        lcp_input[uVar17] = in_R11;
        if (puVar3 == (uchar *)0x0) goto LAB_001d37fd;
        lVar16 = lcp_input[(int)uVar17 - 1];
        if (puVar3[lVar16] == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (uint)puVar3[lVar16] << 0x18;
          if (puVar3[lVar16 + 1] != 0) {
            uVar9 = uVar9 | (uint)puVar3[lVar16 + 1] << 0x10;
            if (puVar3[lVar16 + 2] != '\0') {
              uVar9 = uVar9 | CONCAT11(puVar3[lVar16 + 2],puVar3[lVar16 + 3]);
            }
          }
        }
        cache_input[uVar17] = uVar9;
        uVar17 = uVar18;
      } while (uVar18 < n - 1);
    }
    puVar3 = strings_input[n - 1];
    if (puVar3 != (uchar *)0x0) {
      lVar16 = lcp_input[n - 2];
      uVar9 = 0;
      if (puVar3[lVar16] != 0) {
        uVar9 = (uint)puVar3[lVar16] << 0x18;
        if (puVar3[lVar16 + 1] != 0) {
          uVar9 = (uint)puVar3[lVar16 + 1] << 0x10 | uVar9;
          if (puVar3[lVar16 + 2] != '\0') {
            uVar9 = uVar9 | CONCAT11(puVar3[lVar16 + 2],puVar3[lVar16 + 3]);
          }
        }
      }
      cache_input[n - 1] = uVar9;
      check_input<unsigned_int>(strings_input,lcp_input,cache_input,n);
      return SortedInPlace;
    }
  }
LAB_001d37fd:
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x38,"uint32_t get_char(unsigned char *, size_t)");
}

Assistant:

MergeResult
mergesort_cache_lcp_2way_parallel(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0, m1;
	m0 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	m1 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}